

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdSetRawReissueAsset
              (void *handle,char *tx_hex_string,char *txid,uint32_t vout,int64_t asset_amount,
              char *blinding_nonce,char *entropy,char *address,char *direct_locking_script,
              char **asset_string,char **tx_string)

{
  pointer *ppuVar1;
  bool bVar2;
  CfdException *pCVar3;
  Amount AVar4;
  initializer_list<cfd::api::TxInReissuanceParameters> __l;
  char *work_tx_string;
  char *work_asset_string;
  vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> outputs;
  TxInReissuanceParameters params;
  vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
  issuances;
  ConfidentialTransactionController ctxc;
  ElementsAddressFactory address_factory;
  ConfidentialTxOut asset_txout;
  ConfidentialAssetId local_518;
  allocator local_4ea;
  ElementsTransactionApi local_4e9;
  char *local_4e8;
  char *local_4e0;
  undefined1 local_4d8 [40];
  void *local_4b0;
  uint32_t local_4a4;
  Amount local_4a0;
  char *local_490;
  undefined1 local_488 [24];
  undefined1 local_470 [16];
  Amount AStack_460;
  undefined1 local_450 [24];
  undefined1 local_438 [40];
  undefined1 local_410 [40];
  undefined1 auStack_3e8 [40];
  undefined1 auStack_3c0 [24];
  undefined1 auStack_3a8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_388 [8];
  undefined1 local_380 [40];
  undefined1 local_358 [32];
  BlindFactor local_338 [3];
  vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
  local_2d8;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  pointer local_2a0;
  pointer pCStack_298;
  bool local_290;
  undefined1 local_288 [64];
  ConfidentialValue local_248;
  ConfidentialNonce CStack_220;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vStack_1f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> avStack_1e0 [3];
  BlindFactor local_190;
  BlindFactor local_170;
  AddressFactory local_150;
  undefined1 local_128 [200];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_4e0 = (char *)0x0;
  local_4e8 = (char *)0x0;
  local_4b0 = handle;
  local_4a4 = vout;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar2) {
    local_488._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_488._8_4_ = 0x3c1;
    local_488._16_8_ = "CfdSetRawReissueAsset";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_488,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_488._0_8_ = local_488 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_488,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_488);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string == (char **)0x0) {
    local_488._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_488._8_4_ = 0x3c7;
    local_488._16_8_ = "CfdSetRawReissueAsset";
    cfd::core::logger::log<>((CfdSourceLocation *)local_488,kCfdLogLevelWarning,"tx is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_488._0_8_ = local_488 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_488,"Failed to parameter. output tx is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_488);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (bVar2) {
    local_488._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_488._8_4_ = 0x3cd;
    local_488._16_8_ = "CfdSetRawReissueAsset";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_488,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_488._0_8_ = local_488 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_488,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_488);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(blinding_nonce);
  if (!bVar2) {
    bVar2 = cfd::capi::IsEmptyString(entropy);
    if (!bVar2) {
      cfd::core::ConfidentialTxOut::ConfidentialTxOut((ConfidentialTxOut *)local_128);
      AVar4 = cfd::core::Amount::CreateBySatoshiAmount(asset_amount);
      local_4a0.amount_ = AVar4.amount_;
      local_4a0.ignore_check_ = AVar4.ignore_check_;
      cfd::ElementsAddressFactory::ElementsAddressFactory((ElementsAddressFactory *)&local_150);
      bVar2 = cfd::capi::IsEmptyString(address);
      if (bVar2) {
        bVar2 = cfd::capi::IsEmptyString(direct_locking_script);
        if (!bVar2) {
          std::__cxx11::string::string
                    ((string *)local_488,direct_locking_script,(allocator *)&local_518);
          cfd::core::Script::Script((Script *)local_2c0,(string *)local_488);
          if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
            operator_delete((void *)local_488._0_8_);
          }
          cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_518);
          cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_4d8,&local_4a0)
          ;
          cfd::core::ConfidentialTxOut::ConfidentialTxOut
                    ((ConfidentialTxOut *)local_488,(Script *)local_2c0,&local_518,
                     (ConfidentialValue *)local_4d8);
          local_128[0x10] = (bool)local_488[0x10];
          local_128._8_8_ = CONCAT44(local_488._12_4_,local_488._8_4_);
          cfd::core::Script::operator=((Script *)(local_128 + 0x18),(Script *)local_470);
          cfd::core::ConfidentialAssetId::operator=
                    ((ConfidentialAssetId *)(local_128 + 0x50),(ConfidentialAssetId *)local_438);
          cfd::core::ConfidentialValue::operator=
                    ((ConfidentialValue *)(local_128 + 0x78),(ConfidentialValue *)local_410);
          cfd::core::ConfidentialNonce::operator=
                    ((ConfidentialNonce *)(local_128 + 0xa0),(ConfidentialNonce *)auStack_3e8);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_3c0);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_3a8);
          cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_488);
          local_4d8._0_8_ = &PTR__ConfidentialValue_007357f0;
          if ((pointer)local_4d8._8_8_ != (pointer)0x0) {
            operator_delete((void *)local_4d8._8_8_);
          }
          local_518._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
          if (local_518.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_518.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          cfd::core::Script::~Script((Script *)local_2c0);
        }
      }
      else {
        std::__cxx11::string::string((string *)local_4d8,address,(allocator *)local_488);
        bVar2 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress((string *)local_4d8);
        if (bVar2) {
          cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                    ((ElementsConfidentialAddress *)local_488,(string *)local_4d8);
          cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_518);
          cfd::core::ConfidentialTxOut::ConfidentialTxOut
                    ((ConfidentialTxOut *)local_2c0,(ElementsConfidentialAddress *)local_488,
                     &local_518,&local_4a0);
          local_128[0x10] = local_2b0[0];
          local_128._8_8_ = local_2c0._8_8_;
          cfd::core::Script::operator=((Script *)(local_128 + 0x18),(Script *)(local_2b0 + 8));
          cfd::core::ConfidentialAssetId::operator=
                    ((ConfidentialAssetId *)(local_128 + 0x50),
                     (ConfidentialAssetId *)(local_288 + 0x18));
          cfd::core::ConfidentialValue::operator=
                    ((ConfidentialValue *)(local_128 + 0x78),&local_248);
          cfd::core::ConfidentialNonce::operator=
                    ((ConfidentialNonce *)(local_128 + 0xa0),&CStack_220);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,&vStack_1f8)
          ;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,avStack_1e0)
          ;
          cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_2c0);
          local_518._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
          if (local_518.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_518.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                    ((ElementsConfidentialAddress *)local_488);
        }
        else {
          cfd::AddressFactory::GetAddress((Address *)local_488,&local_150,(string *)local_4d8);
          cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_518);
          cfd::core::ConfidentialTxOut::ConfidentialTxOut
                    ((ConfidentialTxOut *)local_2c0,(Address *)local_488,&local_518,&local_4a0);
          local_128[0x10] = local_2b0[0];
          local_128._8_8_ = local_2c0._8_8_;
          cfd::core::Script::operator=((Script *)(local_128 + 0x18),(Script *)(local_2b0 + 8));
          cfd::core::ConfidentialAssetId::operator=
                    ((ConfidentialAssetId *)(local_128 + 0x50),
                     (ConfidentialAssetId *)(local_288 + 0x18));
          cfd::core::ConfidentialValue::operator=
                    ((ConfidentialValue *)(local_128 + 0x78),&local_248);
          cfd::core::ConfidentialNonce::operator=
                    ((ConfidentialNonce *)(local_128 + 0xa0),&CStack_220);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,&vStack_1f8)
          ;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,avStack_1e0)
          ;
          cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_2c0);
          local_518._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
          if (local_518.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_518.data_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)(local_358 + 0x18));
          cfd::core::Script::~Script((Script *)local_380);
          local_410._0_8_ = &PTR__TaprootScriptTree_00740b18;
          std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     (auStack_3a8 + 0x10));
          cfd::core::TapBranch::~TapBranch((TapBranch *)local_410);
          if ((pointer)local_438._16_8_ != (pointer)0x0) {
            operator_delete((void *)local_438._16_8_);
          }
          if ((void *)CONCAT71(local_450._17_7_,local_450[0x10]) != (void *)0x0) {
            operator_delete((void *)CONCAT71(local_450._17_7_,local_450[0x10]));
          }
          if ((void *)CONCAT71(AStack_460._9_7_,AStack_460.ignore_check_) != (void *)0x0) {
            operator_delete((void *)CONCAT71(AStack_460._9_7_,AStack_460.ignore_check_));
          }
          if ((undefined1 *)local_488._16_8_ != local_470 + 8) {
            operator_delete((void *)local_488._16_8_);
          }
        }
        if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
          operator_delete((void *)local_4d8._0_8_);
        }
      }
      cfd::core::Txid::Txid((Txid *)local_488);
      cfd::core::Amount::Amount(&AStack_460);
      cfd::core::ConfidentialTxOut::ConfidentialTxOut((ConfidentialTxOut *)local_450);
      local_490 = tx_hex_string;
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_358);
      cfd::core::BlindFactor::BlindFactor(local_338);
      std::__cxx11::string::string((string *)&local_518,txid,(allocator *)local_4d8);
      cfd::core::Txid::Txid((Txid *)local_2c0,(string *)&local_518);
      cfd::core::Txid::operator=((Txid *)local_488,(Txid *)local_2c0);
      local_2c0._0_8_ = &PTR__Txid_00735400;
      if ((pointer)local_2c0._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2c0._8_8_);
      }
      ppuVar1 = (pointer *)
                ((long)&local_518.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (local_518._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
        operator_delete(local_518._vptr_ConfidentialAssetId);
      }
      local_470._8_4_ = local_4a4;
      AStack_460.ignore_check_ = local_4a0.ignore_check_;
      AStack_460.amount_ = local_4a0.amount_;
      local_450._8_8_ = local_128._8_8_;
      local_450[0x10] = local_128[0x10];
      cfd::core::Script::operator=((Script *)local_438,(Script *)(local_128 + 0x18));
      cfd::core::ConfidentialAssetId::operator=
                ((ConfidentialAssetId *)(local_410 + 0x10),(ConfidentialAssetId *)(local_128 + 0x50)
                );
      cfd::core::ConfidentialValue::operator=
                ((ConfidentialValue *)(auStack_3e8 + 0x10),(ConfidentialValue *)(local_128 + 0x78));
      cfd::core::ConfidentialNonce::operator=
                ((ConfidentialNonce *)(auStack_3c0 + 0x10),(ConfidentialNonce *)(local_128 + 0xa0));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_388,&local_60);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_380 + 0x10),
                 &local_48);
      std::__cxx11::string::string((string *)&local_518,blinding_nonce,(allocator *)local_4d8);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_2c0,(string *)&local_518);
      cfd::core::BlindFactor::operator=((BlindFactor *)local_358,(BlindFactor *)local_2c0);
      local_2c0._0_8_ = &PTR__BlindFactor_007354b0;
      if ((pointer)local_2c0._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2c0._8_8_);
      }
      if (local_518._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
        operator_delete(local_518._vptr_ConfidentialAssetId);
      }
      std::__cxx11::string::string((string *)&local_518,entropy,(allocator *)local_4d8);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_2c0,(string *)&local_518);
      cfd::core::BlindFactor::operator=(local_338,(BlindFactor *)local_2c0);
      local_2c0._0_8_ = &PTR__BlindFactor_007354b0;
      if ((pointer)local_2c0._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2c0._8_8_);
      }
      if (local_518._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
        operator_delete(local_518._vptr_ConfidentialAssetId);
      }
      local_4d8._0_8_ = (_func_int **)0x0;
      local_4d8._8_8_ = (pointer)0x0;
      local_4d8._16_8_ = (pointer)0x0;
      cfd::core::Txid::Txid((Txid *)local_2c0,(Txid *)local_488);
      local_290 = AStack_460.ignore_check_;
      local_2a0 = (pointer)CONCAT44(local_470._12_4_,local_470._8_4_);
      pCStack_298 = (pointer)AStack_460.amount_;
      cfd::core::ConfidentialTxOut::ConfidentialTxOut
                ((ConfidentialTxOut *)local_288,(ConfidentialTxOut *)local_450);
      cfd::core::BlindFactor::BlindFactor(&local_190,(BlindFactor *)local_358);
      cfd::core::BlindFactor::BlindFactor(&local_170,local_338);
      __l._M_len = 1;
      __l._M_array = (iterator)local_2c0;
      std::
      vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
      ::vector(&local_2d8,__l,(allocator_type *)&local_518);
      local_170._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
      if (local_170.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_190._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
      if (local_190.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_190.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_288);
      local_2c0._0_8_ = &PTR__Txid_00735400;
      if ((pointer)local_2c0._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_2c0._8_8_);
      }
      std::__cxx11::string::string((string *)&local_518,local_490,&local_4ea);
      cfd::api::ElementsTransactionApi::SetRawReissueAsset
                ((ConfidentialTransactionController *)local_2c0,&local_4e9,(string *)&local_518,
                 &local_2d8,
                 (vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *)
                 local_4d8);
      if (local_518._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
        operator_delete(local_518._vptr_ConfidentialAssetId);
      }
      if ((asset_string != (char **)0x0) && (local_4d8._0_8_ != local_4d8._8_8_)) {
        cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                  ((string *)&local_518,(ConfidentialAssetId *)(local_4d8._0_8_ + 0x48));
        local_4e0 = cfd::capi::CreateString((string *)&local_518);
        if (local_518._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
          operator_delete(local_518._vptr_ConfidentialAssetId);
        }
      }
      cfd::AbstractTransactionController::GetHex_abi_cxx11_
                ((string *)&local_518,(AbstractTransactionController *)local_2c0);
      local_4e8 = cfd::capi::CreateString((string *)&local_518);
      if (local_518._vptr_ConfidentialAssetId != (_func_int **)ppuVar1) {
        operator_delete(local_518._vptr_ConfidentialAssetId);
      }
      if (local_4e0 != (char *)0x0) {
        *asset_string = local_4e0;
      }
      *tx_string = local_4e8;
      local_2c0._0_8_ = &PTR__ConfidentialTransactionController_00735388;
      cfd::core::ConfidentialTransaction::~ConfidentialTransaction
                ((ConfidentialTransaction *)local_2b0);
      std::
      vector<cfd::api::TxInReissuanceParameters,_std::allocator<cfd::api::TxInReissuanceParameters>_>
      ::~vector(&local_2d8);
      std::vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_>::~vector
                ((vector<cfd::api::IssuanceOutput,_std::allocator<cfd::api::IssuanceOutput>_> *)
                 local_4d8);
      local_338[0]._vptr_BlindFactor = (_func_int **)&PTR__BlindFactor_007354b0;
      if ((_Base_ptr)
          local_338[0].data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
        operator_delete(local_338[0].data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_358._0_8_ = &PTR__BlindFactor_007354b0;
      if ((pointer)local_358._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_358._8_8_);
      }
      cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_450);
      local_488._0_8_ = &PTR__Txid_00735400;
      if ((void *)CONCAT44(local_488._12_4_,local_488._8_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_488._12_4_,local_488._8_4_));
      }
      local_150._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_150.prefix_list_);
      cfd::core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)local_128);
      return 0;
    }
    local_488._0_8_ = "cfdcapi_elements_transaction.cpp";
    local_488._8_4_ = 0x3d9;
    local_488._16_8_ = "CfdSetRawReissueAsset";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_488,kCfdLogLevelWarning,"entropy is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_488._0_8_ = local_488 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_488,"Failed to parameter. entropy is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_488);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_488._0_8_ = "cfdcapi_elements_transaction.cpp";
  local_488._8_4_ = 0x3d3;
  local_488._16_8_ = "CfdSetRawReissueAsset";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_488,kCfdLogLevelWarning,"blinding nonce is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_488._0_8_ = local_488 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_488,"Failed to parameter. blinding nonce is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_488);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSetRawReissueAsset(
    void* handle, const char* tx_hex_string, const char* txid, uint32_t vout,
    int64_t asset_amount, const char* blinding_nonce, const char* entropy,
    const char* address, const char* direct_locking_script,
    char** asset_string, char** tx_string) {
  char* work_asset_string = nullptr;
  char* work_tx_string = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output tx is null.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(blinding_nonce)) {
      warn(CFD_LOG_SOURCE, "blinding nonce is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. blinding nonce is null or empty.");
    }
    if (IsEmptyString(entropy)) {
      warn(CFD_LOG_SOURCE, "entropy is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. entropy is null or empty.");
    }

    ConfidentialTxOut asset_txout;
    Amount amount = Amount::CreateBySatoshiAmount(asset_amount);
    ElementsAddressFactory address_factory;
    if (!IsEmptyString(address)) {
      std::string addr(address);
      if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
        ElementsConfidentialAddress confidential_addr(addr);
        asset_txout = ConfidentialTxOut(
            confidential_addr, ConfidentialAssetId(), amount);
      } else {
        Address unblind_addr = address_factory.GetAddress(addr);
        asset_txout =
            ConfidentialTxOut(unblind_addr, ConfidentialAssetId(), amount);
      }
    } else if (!IsEmptyString(direct_locking_script)) {
      Script script(direct_locking_script);
      asset_txout = ConfidentialTxOut(
          script, ConfidentialAssetId(), ConfidentialValue(amount));
    }

    TxInReissuanceParameters params;
    params.txid = Txid(std::string(txid));
    params.vout = vout;
    params.amount = amount;
    params.asset_txout = asset_txout;
    params.blind_factor = BlindFactor(std::string(blinding_nonce));
    params.entropy = BlindFactor(std::string(entropy));

    ElementsTransactionApi api;
    std::vector<IssuanceOutput> outputs;
    std::vector<TxInReissuanceParameters> issuances{params};
    ConfidentialTransactionController ctxc =
        api.SetRawReissueAsset(tx_hex_string, issuances, &outputs);

    if (!outputs.empty() && (asset_string != nullptr)) {
      work_asset_string = CreateString(outputs[0].output.asset.GetHex());
    }
    work_tx_string = CreateString(ctxc.GetHex());

    if (work_asset_string != nullptr) *asset_string = work_asset_string;
    *tx_string = work_tx_string;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_asset_string, &work_tx_string);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_asset_string, &work_tx_string);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_asset_string, &work_tx_string);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}